

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_iterator.cpp
# Opt level: O1

bool __thiscall QFSFileEngineIterator::advance(QFSFileEngineIterator *this)

{
  totally_ordered_wrapper<QFileInfoPrivate_*> tVar1;
  undefined1 *puVar2;
  bool bVar3;
  QFileInfoPrivate *p;
  long lVar4;
  long in_FS_OFFSET;
  QFileSystemMetaData data;
  QFileSystemEntry entry;
  QSharedDataPointer<QFileInfoPrivate> local_b0;
  QFileSystemMetaData local_a8;
  undefined1 local_68 [52];
  qint16 qStack_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->nativeIterator)._M_t.
      super___uniq_ptr_impl<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>._M_t.
      super__Tuple_impl<0UL,_QFileSystemIterator_*,_std::default_delete<QFileSystemIterator>_>.
      super__Head_base<0UL,_QFileSystemIterator_*,_false>._M_head_impl == (QFileSystemIterator *)0x0
     ) {
    bVar3 = false;
  }
  else {
    stack0xffffffffffffffc8 = &DAT_aaaaaaaaaaaaaaaa;
    local_68._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)local_68);
    local_a8.knownFlagsMask.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
    super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
         (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)0x0;
    local_a8.entryFlags.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
    super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
         (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)0x0;
    local_a8.size_ = -1;
    local_a8.accessTime_ = 0;
    local_a8.birthTime_ = 0;
    local_a8.metadataChangeTime_ = 0;
    local_a8.modificationTime_ = 0;
    local_a8.userId_ = 0xfffffffe;
    local_a8.groupId_ = 0xfffffffe;
    bVar3 = QFileSystemIterator::advance
                      ((this->nativeIterator)._M_t.
                       super___uniq_ptr_impl<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_QFileSystemIterator_*,_std::default_delete<QFileSystemIterator>_>
                       .super__Head_base<0UL,_QFileSystemIterator_*,_false>._M_head_impl,
                       (QFileSystemEntry *)local_68,&local_a8);
    if (bVar3) {
      p = (QFileInfoPrivate *)operator_new(0x1e8);
      puVar2 = stack0xffffffffffffffc8;
      (p->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 0;
      (p->fileEntry).m_filePath.d.d = (Data *)local_68._0_8_;
      (p->fileEntry).m_filePath.d.ptr = (char16_t *)local_68._8_8_;
      (p->fileEntry).m_filePath.d.size = local_68._16_8_;
      if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_68._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_68._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      (p->fileEntry).m_nativeFilePath.d.d = (Data *)local_68._24_8_;
      (p->fileEntry).m_nativeFilePath.d.ptr = (char *)local_68._32_8_;
      (p->fileEntry).m_nativeFilePath.d.size = local_68._40_8_;
      if ((QArrayData *)local_68._24_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_68._24_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_68._24_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      (p->fileEntry).m_lastDotInFileName = qStack_34;
      (p->fileEntry).m_lastSeparator = local_68._48_2_;
      (p->fileEntry).m_firstDotInFileName = local_68._50_2_;
      (p->metaData).knownFlagsMask =
           (MetaDataFlags)
           local_a8.knownFlagsMask.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
           super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i;
      (p->metaData).entryFlags =
           (MetaDataFlags)
           local_a8.entryFlags.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
           super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i;
      (p->metaData).size_ = local_a8.size_;
      (p->metaData).accessTime_ = local_a8.accessTime_;
      (p->metaData).birthTime_ = local_a8.birthTime_;
      (p->metaData).metadataChangeTime_ = local_a8.metadataChangeTime_;
      (p->metaData).modificationTime_ = local_a8.modificationTime_;
      (p->metaData).userId_ = local_a8.userId_;
      (p->metaData).groupId_ = local_a8.groupId_;
      unique0x10000a00 = puVar2;
      QFileSystemEngine::createLegacyEngine
                ((QFileSystemEntry *)&p->fileEngine,(QFileSystemMetaData *)&p->fileEntry);
      memset(p->fileNames,0,0x138);
      lVar4 = 0x1b8;
      do {
        QDateTime::QDateTime((QDateTime *)((long)p->fileNames + lVar4 + -0x80));
        lVar4 = lVar4 + 8;
      } while (lVar4 != 0x1d8);
      *(undefined8 *)&p->field_0x1d8 = 0x80000000;
      p->fileSize = 0;
      if ((p->fileEngine)._M_t.
          super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t
          .super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
          super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl !=
          (QAbstractFileEngine *)0x0) {
        (p->metaData).knownFlagsMask =
             (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)0x0;
        (p->metaData).entryFlags = (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)0x0;
        (p->metaData).size_ = -1;
        (p->metaData).accessTime_ = 0;
        (p->metaData).birthTime_ = 0;
        (p->metaData).metadataChangeTime_ = 0;
        (p->metaData).modificationTime_ = 0;
        (p->metaData).userId_ = 0xfffffffe;
        (p->metaData).groupId_ = 0xfffffffe;
      }
      QFileInfo::QFileInfo((QFileInfo *)&local_b0,p);
      tVar1.ptr = (this->super_QAbstractFileEngineIterator).m_fileInfo.d_ptr.d.ptr;
      (this->super_QAbstractFileEngineIterator).m_fileInfo.d_ptr.d.ptr =
           (QFileInfoPrivate *)local_b0.d.ptr;
      local_b0.d.ptr =
           (totally_ordered_wrapper<QFileInfoPrivate_*>)
           (totally_ordered_wrapper<QFileInfoPrivate_*>)tVar1.ptr;
      QFileInfo::~QFileInfo((QFileInfo *)&local_b0);
    }
    else {
      std::__uniq_ptr_impl<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>::reset
                ((__uniq_ptr_impl<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_> *)
                 &this->nativeIterator,(pointer)0x0);
    }
    if ((QArrayData *)local_68._24_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._24_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._24_8_,1,0x10);
      }
    }
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngineIterator::advance()
{
    if (!nativeIterator)
        return false;

    QFileSystemEntry entry;
    QFileSystemMetaData data;
    if (nativeIterator->advance(entry, data)) {
        m_fileInfo = QFileInfo(new QFileInfoPrivate(entry, data));
        return true;
    } else {
        nativeIterator.reset();
        return false;
    }
}